

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O3

lzma_ret lzma_decode(lzma_coder_conflict8 *coder,lzma_dict *dictptr,uint8_t *in,size_t *in_pos,
                    size_t in_size)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint8_t *puVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  byte bVar10;
  short sVar11;
  bool bVar12;
  bool bVar13;
  uint32_t uVar14;
  uint uVar15;
  uint uVar16;
  size_t sVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  probability *ppVar24;
  uint8_t *__src;
  lzma_vli lVar25;
  uint8_t *__dest;
  size_t sVar26;
  size_t sVar27;
  size_t sVar28;
  lzma_ret lVar29;
  uint32_t uVar30;
  uint uVar31;
  int iVar32;
  ulong uVar33;
  uint uVar34;
  ulong __n;
  ulong local_f8;
  probability (*local_e8) [768];
  lzma_lzma_state local_d0;
  uint local_cc;
  uint local_bc;
  ulong local_b8;
  size_t local_b0;
  uint local_a4;
  
  puVar6 = dictptr->buf;
  sVar7 = dictptr->pos;
  local_b0 = dictptr->full;
  sVar28 = dictptr->limit;
  sVar8 = dictptr->size;
  uVar14 = (coder->rc).init_bytes_left;
  local_d0 = coder->state;
  uVar9 = coder->uncompressed_size;
  sVar27 = sVar7 + uVar9;
  if (sVar28 - sVar7 <= uVar9) {
    sVar27 = sVar28;
  }
  uVar18 = coder->rep0;
  uVar33 = (ulong)uVar18;
  if (uVar9 == 0xffffffffffffffff) {
    sVar27 = sVar28;
  }
  local_bc = coder->rep1;
  local_cc = coder->rep2;
  local_a4 = coder->rep3;
  uVar3 = coder->pos_mask;
  local_e8 = (probability (*) [768])coder->probs;
  uVar34 = coder->symbol;
  uVar22 = (ulong)uVar34;
  uVar30 = coder->limit;
  uVar16 = coder->offset;
  uVar15 = coder->len;
  local_f8 = (ulong)uVar15;
  uVar4 = coder->literal_pos_mask;
  uVar5 = coder->literal_context_bits;
  if (uVar14 == 0) {
    uVar23 = (coder->rc).code;
    sVar28 = *in_pos;
  }
  else {
    sVar28 = *in_pos;
    do {
      uVar14 = uVar14 - 1;
      if (in_size == sVar28) {
        return LZMA_OK;
      }
      uVar23 = (uint)in[sVar28] | (coder->rc).code << 8;
      (coder->rc).code = uVar23;
      sVar28 = sVar28 + 1;
      *in_pos = sVar28;
      (coder->rc).init_bytes_left = uVar14;
    } while (uVar14 != 0);
  }
  uVar31 = (coder->rc).range;
  sVar17 = sVar7;
  if (coder->sequence < (SEQ_COPY|SEQ_BLOCK_HEADER)) {
    local_b8 = (ulong)(uVar3 & (uint)sVar7);
    sVar26 = sVar7;
    uVar21 = uVar23;
    uVar20 = uVar23;
    uVar15 = uVar16;
    switch(coder->sequence) {
    default:
      do {
        uVar34 = (uint)uVar22;
        uVar18 = (uint)uVar33;
        if ((uVar9 != 0xffffffffffffffff) &&
           (sVar17 = sVar27, uVar15 = (uint)local_f8, sVar26 == sVar27)) goto LAB_004dc19b;
        uVar18 = uVar31;
        if (uVar31 < 0x1000000) {
          if (sVar28 != in_size) {
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar23 = uVar23 << 8 | (uint)*pbVar1;
            uVar18 = uVar31 << 8;
            goto LAB_004dc258;
          }
          coder->sequence = SEQ_BLOCK_HEADER;
          sVar27 = sVar26;
          sVar28 = in_size;
LAB_004def73:
          uVar34 = (uint)uVar22;
          uVar18 = (uint)uVar33;
          sVar26 = sVar27;
          in_size = sVar28;
          goto LAB_004def76;
        }
LAB_004dc258:
        ppVar24 = coder->is_match[local_d0] + local_b8;
        uVar2 = *ppVar24;
        uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
        uVar20 = uVar23 - uVar31;
        if (uVar23 < uVar31) {
          *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
          bVar10 = (byte)uVar5;
          sVar17 = 0;
          if (sVar26 == 0) {
            sVar17 = sVar8;
          }
          local_e8 = coder->literal +
                     (ulong)(puVar6[(sVar17 - 1) + sVar26] >> (8 - bVar10 & 0x1f)) +
                     ((ulong)((uint)sVar26 & uVar4) << (bVar10 & 0x3f));
          uVar22 = 1;
          if (local_d0 < STATE_LIT_MATCH) {
switchD_004dc17b_caseD_2:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_BLOCK;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = uVar23 << 8 | (uint)*pbVar1;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_3:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_CODER_INIT;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = uVar20 << 8 | (uint)*pbVar1;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar23 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar23 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_4:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_CODE;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = uVar23 << 8 | (uint)*pbVar1;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_5:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL3;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = uVar20 << 8 | (uint)*pbVar1;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar23 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar23 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_6:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_CRC32;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_7:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL5;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar23 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar23 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_8:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL6;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_9:
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL7;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar18 = (int)uVar22 * 2;
            uVar19 = (ulong)uVar18;
            uVar23 = uVar20 - uVar34;
            if (uVar20 < uVar34) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar23 = uVar20;
              uVar31 = uVar34;
            }
            else {
              uVar31 = uVar31 - uVar34;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar19 = (ulong)(uVar18 | 1);
            }
          }
          else {
            sVar17 = 0;
            if (sVar26 <= uVar33) {
              sVar17 = sVar8;
            }
            local_f8 = (ulong)((uint)puVar6[sVar17 + ~uVar33 + sVar26] * 2);
            uVar16 = 0x100;
            uVar34 = 1;
switchD_004dc17b_caseD_a:
            uVar18 = (uint)uVar33;
            uVar15 = uVar16 & (uint)local_f8;
            uVar21 = uVar16 + uVar34 + uVar15;
            uVar20 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED0;
                bVar13 = false;
                bVar12 = true;
                lVar29 = LZMA_OK;
                sVar28 = in_size;
                goto LAB_004def80;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar21];
            uVar18 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar34 = uVar34 * 2;
            uVar23 = uVar20 - uVar18;
            if (uVar20 < uVar18) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar16;
              uVar23 = uVar20;
              uVar31 = uVar18;
            }
            else {
              uVar31 = uVar31 - uVar18;
              sVar11 = -(uVar2 >> 5);
              uVar34 = uVar34 | 1;
            }
            uVar22 = (ulong)uVar34;
            (*local_e8)[uVar21] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_b:
            uVar16 = uVar15 & (uint)local_f8;
            uVar34 = uVar15 + (int)uVar22 + uVar16;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED1;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar16 = uVar15;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar16 = uVar16 ^ uVar15;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar22 = (ulong)uVar20;
            (*local_e8)[uVar34] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_c:
            uVar15 = uVar16 & (uint)local_f8;
            uVar34 = uVar16 + (int)uVar22 + uVar15;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED2;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar16;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar22 = (ulong)uVar20;
            (*local_e8)[uVar34] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_d:
            uVar16 = uVar15 & (uint)local_f8;
            uVar34 = uVar15 + (int)uVar22 + uVar16;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED3;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar16 = uVar15;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar16 = uVar16 ^ uVar15;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar22 = (ulong)uVar20;
            (*local_e8)[uVar34] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_e:
            uVar15 = uVar16 & (uint)local_f8;
            uVar34 = uVar16 + (int)uVar22 + uVar15;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED4;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar16;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar22 = (ulong)uVar20;
            (*local_e8)[uVar34] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_f:
            uVar16 = uVar15 & (uint)local_f8;
            uVar34 = uVar15 + (int)uVar22 + uVar16;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED5;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar16 = uVar15;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar16 = uVar16 ^ uVar15;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar22 = (ulong)uVar20;
            (*local_e8)[uVar34] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_10:
            uVar15 = uVar16 & (uint)local_f8;
            uVar34 = uVar16 + (int)uVar22 + uVar15;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED6;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar15 = uVar15 ^ uVar16;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              sVar11 = -(uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar22 = (ulong)uVar20;
            (*local_e8)[uVar34] = sVar11 + uVar2;
            local_f8 = (ulong)((uint)local_f8 * 2);
switchD_004dc17b_caseD_11:
            uVar16 = uVar15 & (uint)local_f8;
            uVar34 = uVar15 + (int)uVar22 + uVar16;
            uVar18 = uVar23;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_LITERAL_MATCHED7;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar16 = uVar15;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar18 = (uint)*pbVar1 | uVar23 << 8;
            }
            uVar2 = (*local_e8)[uVar34];
            uVar21 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar20 = (int)uVar22 * 2;
            uVar23 = uVar18 - uVar21;
            if (uVar18 < uVar21) {
              (*local_e8)[uVar34] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar16 = uVar16 ^ uVar15;
              uVar23 = uVar18;
              uVar31 = uVar21;
            }
            else {
              uVar31 = uVar31 - uVar21;
              (*local_e8)[uVar34] = uVar2 - (uVar2 >> 5);
              uVar20 = uVar20 | 1;
            }
            uVar19 = (ulong)uVar20;
          }
          local_d0 = lzma_decode::next_state[local_d0];
          uVar22 = uVar19;
switchD_004dc17b_caseD_12:
          if (sVar26 == sVar27) {
            coder->sequence = SEQ_LITERAL_WRITE;
            goto LAB_004def73;
          }
          puVar6[sVar26] = (uint8_t)uVar22;
LAB_004dea19:
          sVar26 = sVar26 + 1;
          if (local_b0 < sVar26) {
            local_b0 = sVar26;
          }
        }
        else {
          uVar31 = uVar18 - uVar31;
          *ppVar24 = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_13:
          uVar15 = local_cc;
          uVar34 = (uint)uVar22;
          uVar18 = (uint)uVar33;
          local_cc = local_bc;
          uVar23 = uVar20;
          uVar21 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar28 == in_size) {
              coder->sequence = SEQ_IS_REP;
              sVar28 = in_size;
              local_cc = uVar15;
              goto LAB_004dc1dd;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar23 = (uint)*pbVar1 | uVar20 << 8;
            uVar21 = uVar31 << 8;
          }
          uVar19 = (ulong)local_d0;
          uVar2 = coder->is_rep[uVar19];
          uVar31 = (uVar21 >> 0xb) * (uint)uVar2;
          uVar20 = uVar23 - uVar31;
          if (uVar23 < uVar31) {
            coder->is_rep[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
            local_d0 = (uint)(STATE_SHORTREP_LIT < local_d0) * 3 + STATE_LIT_MATCH;
            uVar22 = 1;
            local_a4 = uVar15;
            local_bc = uVar18;
switchD_004dc17b_caseD_14:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_MATCH_LEN_CHOICE;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (coder->match_len_decoder).choice;
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (coder->match_len_decoder).choice = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_004dc17b_caseD_15:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_LOW0;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              ppVar24 = (coder->match_len_decoder).low[local_b8] + uVar22;
              uVar2 = *ppVar24;
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                *ppVar24 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_16:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_LOW1;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              ppVar24 = (coder->match_len_decoder).low[local_b8] + uVar22;
              uVar2 = *ppVar24;
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar34;
              uVar21 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar21 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                *ppVar24 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_17:
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_LOW2;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar21;
                  goto LAB_004def73;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar21 = (uint)*pbVar1 | uVar21 << 8;
              }
              ppVar24 = (coder->match_len_decoder).low[local_b8] + uVar22;
              uVar2 = *ppVar24;
              uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar18 = (int)uVar22 * 2;
              uVar23 = uVar21 - uVar34;
              if (uVar21 < uVar34) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar23 = uVar21;
              }
              else {
                uVar34 = uVar31 - uVar34;
                sVar11 = -(uVar2 >> 5);
                uVar18 = uVar18 | 1;
              }
              *ppVar24 = sVar11 + uVar2;
              local_f8 = (ulong)(uVar18 - 6);
              uVar31 = uVar34;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (coder->match_len_decoder).choice = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_18:
              uVar23 = uVar20;
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_MATCH_LEN_CHOICE2;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->match_len_decoder).choice2;
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                (coder->match_len_decoder).choice2 = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_004dc17b_caseD_19:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_MID0;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar23 = (uint)*pbVar1 | uVar23 << 8;
                  uVar18 = uVar31 << 8;
                }
                ppVar24 = (coder->match_len_decoder).mid[local_b8] + uVar22;
                uVar2 = *ppVar24;
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar22 = (ulong)uVar34;
                uVar20 = uVar23 - uVar31;
                if (uVar23 < uVar31) {
                  *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar20 = uVar23;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  *ppVar24 = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_1a:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_MID1;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar20;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                  uVar18 = uVar31 << 8;
                }
                ppVar24 = (coder->match_len_decoder).mid[local_b8] + uVar22;
                uVar2 = *ppVar24;
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar22 = (ulong)uVar34;
                uVar21 = uVar20 - uVar31;
                if (uVar20 < uVar31) {
                  *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar21 = uVar20;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  *ppVar24 = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_1b:
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_MID2;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar21;
                    goto LAB_004def73;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar21 = (uint)*pbVar1 | uVar21 << 8;
                }
                ppVar24 = (coder->match_len_decoder).mid[local_b8] + uVar22;
                uVar2 = *ppVar24;
                uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar18 = (int)uVar22 * 2;
                uVar23 = uVar21 - uVar34;
                if (uVar21 < uVar34) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar23 = uVar21;
                }
                else {
                  uVar34 = uVar31 - uVar34;
                  sVar11 = -(uVar2 >> 5);
                  uVar18 = uVar18 | 1;
                }
                *ppVar24 = sVar11 + uVar2;
                local_f8 = (ulong)(uVar18 + 2);
                uVar31 = uVar34;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->match_len_decoder).choice2 = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_1c:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH0;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar20;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar23 = uVar20 - uVar31;
                if (uVar20 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar23 = uVar20;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_1d:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH1;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar23 = (uint)*pbVar1 | uVar23 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar20 = uVar23 - uVar31;
                if (uVar23 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar20 = uVar23;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_1e:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH2;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar20;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar23 = uVar20 - uVar31;
                if (uVar20 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar23 = uVar20;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_1f:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH3;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar23 = (uint)*pbVar1 | uVar23 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar20 = uVar23 - uVar31;
                if (uVar23 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar20 = uVar23;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_20:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH4;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar20;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar23 = uVar20 - uVar31;
                if (uVar20 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar23 = uVar20;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_21:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH5;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar23 = (uint)*pbVar1 | uVar23 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar20 = uVar23 - uVar31;
                if (uVar23 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar20 = uVar23;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_22:
                uVar18 = uVar31;
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH6;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar20;
                    goto LAB_004def73;
                  }
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar20 = (uint)*pbVar1 | uVar20 << 8;
                  uVar18 = uVar31 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
                uVar34 = (int)uVar22 * 2;
                uVar21 = uVar20 - uVar31;
                if (uVar20 < uVar31) {
                  (coder->match_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                  uVar22 = (ulong)uVar34;
                  uVar21 = uVar20;
                }
                else {
                  uVar31 = uVar18 - uVar31;
                  (coder->match_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                  uVar22 = (ulong)(uVar34 | 1);
                }
switchD_004dc17b_caseD_23:
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_MATCH_LEN_HIGH7;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    uVar23 = uVar21;
                    goto LAB_004def73;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar21 = (uint)*pbVar1 | uVar21 << 8;
                }
                uVar2 = (coder->match_len_decoder).high[uVar22];
                uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
                uVar18 = (int)uVar22 * 2;
                uVar23 = uVar21 - uVar34;
                if (uVar21 < uVar34) {
                  sVar11 = (short)(0x800 - uVar2 >> 5);
                  uVar23 = uVar21;
                }
                else {
                  uVar34 = uVar31 - uVar34;
                  sVar11 = -(uVar2 >> 5);
                  uVar18 = uVar18 | 1;
                }
                (coder->match_len_decoder).high[uVar22] = sVar11 + uVar2;
                local_f8 = (ulong)(uVar18 - 0xee);
                uVar31 = uVar34;
              }
            }
            uVar22 = 3;
            if ((uint)local_f8 < 6) {
              uVar22 = (ulong)((uint)local_f8 - 2);
            }
            local_e8 = (probability (*) [768])(coder->pos_slot + uVar22);
            uVar22 = 1;
switchD_004dc17b_caseD_24:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_POS_SLOT0;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_25:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_POS_SLOT1;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar23 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar23 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_26:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_POS_SLOT2;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_27:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_POS_SLOT3;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar23 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar23 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_28:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_POS_SLOT4;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_29:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_POS_SLOT5;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (*local_e8)[uVar22];
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar23 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar23 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              sVar11 = -(uVar2 >> 5);
              uVar34 = uVar34 | 1;
            }
            (*local_e8)[uVar22] = sVar11 + uVar2;
            uVar18 = uVar34 - 0x40;
            uVar22 = (ulong)uVar18;
            if (0x3f < uVar18) {
              __assert_fail("symbol <= 63",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                            ,0x213,
                            "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                           );
            }
            uVar33 = uVar22;
            if (uVar18 < 4) {
switchD_004de121_default:
              if (uVar33 < local_b0) goto LAB_004ded80;
            }
            else {
              uVar30 = (uVar18 >> 1) - 1;
              uVar15 = uVar34 & 1 | 2;
              uVar33 = (ulong)uVar15;
              if (uVar18 < 0xe) {
                if (5 < uVar30) {
                  __assert_fail("limit <= 5",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x222,
                                "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                uVar15 = uVar15 << ((byte)uVar30 & 0x1f);
                uVar33 = (ulong)uVar15;
                if ((int)(uVar15 - uVar34) < -0x40) {
                  __assert_fail("(int32_t)(rep0 - symbol - 1) >= -1",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x22c,
                                "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                if (0x13 < (int)(uVar15 - uVar34)) {
                  __assert_fail("(int32_t)(rep0 - symbol - 1) <= 82",
                                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                ,0x22e,
                                "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                               );
                }
                local_e8 = (probability (*) [768])
                           ((long)coder + uVar22 * -2 + (ulong)uVar15 * 2 + 0x655e);
                uVar16 = 0;
                uVar22 = 1;
switchD_004dc17b_caseD_2a:
                uVar19 = uVar22;
                switch(uVar30) {
                case 1:
                  goto LAB_004decd6;
                case 2:
                  goto switchD_004de121_caseD_2;
                case 3:
                  goto switchD_004de121_caseD_3;
                case 4:
                  goto switchD_004de121_caseD_4;
                case 5:
                  if (uVar16 != 0) {
                    __assert_fail("offset == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                                  ,0x23d,
                                  "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                                 );
                  }
                  uVar18 = uVar23;
                  uVar34 = uVar31;
                  if (0xffffff < uVar31) {
LAB_004dea70:
                    uVar2 = (*local_e8)[uVar22];
                    uVar31 = (uVar34 >> 0xb) * (uint)uVar2;
                    uVar16 = (int)uVar22 * 2;
                    uVar19 = (ulong)uVar16;
                    uVar23 = uVar18 - uVar31;
                    if (uVar18 < uVar31) {
                      (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                      uVar16 = 1;
                      uVar23 = uVar18;
                    }
                    else {
                      uVar31 = uVar34 - uVar31;
                      (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
                      uVar19 = (ulong)(uVar16 | 1);
                      uVar33 = (ulong)((int)uVar33 + 1);
                      uVar16 = 1;
                    }
                    goto switchD_004de121_caseD_4;
                  }
                  if (sVar28 != in_size) {
                    pbVar1 = in + sVar28;
                    sVar28 = sVar28 + 1;
                    uVar18 = (uint)*pbVar1 | uVar23 << 8;
                    uVar34 = uVar31 << 8;
                    goto LAB_004dea70;
                  }
                  coder->sequence = SEQ_POS_MODEL;
                  uVar16 = 0;
                  uVar30 = 5;
                  goto LAB_004df88b;
                default:
                  goto switchD_004de121_default;
                }
              }
              if (uVar30 < 6) {
                __assert_fail("limit >= 6",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                              ,0x266,
                              "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                             );
              }
              uVar30 = (uVar18 >> 1) - 5;
switchD_004dc17b_caseD_2b:
              do {
                if (uVar31 < 0x1000000) {
                  if (sVar28 == in_size) {
                    coder->sequence = SEQ_DIRECT;
                    sVar27 = sVar26;
                    sVar28 = in_size;
                    goto LAB_004def73;
                  }
                  uVar31 = uVar31 << 8;
                  pbVar1 = in + sVar28;
                  sVar28 = sVar28 + 1;
                  uVar23 = uVar23 << 8 | (uint)*pbVar1;
                }
                uVar31 = uVar31 >> 1;
                uVar18 = (int)(uVar23 - uVar31) >> 0x1f;
                uVar34 = uVar18 + (int)uVar33 * 2 + 1;
                uVar33 = (ulong)uVar34;
                uVar23 = (uVar18 & uVar31) + (uVar23 - uVar31);
                uVar30 = uVar30 - 1;
              } while (uVar30 != 0);
              uVar33 = (ulong)(uVar34 * 0x10);
              uVar30 = 0;
              uVar22 = 1;
switchD_004dc17b_caseD_2c:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_ALIGN0;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = coder->pos_align[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                coder->pos_align[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                coder->pos_align[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
                uVar33 = (ulong)((int)uVar33 + 1);
              }
switchD_004dc17b_caseD_2d:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_ALIGN1;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = coder->pos_align[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar23 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                coder->pos_align[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar23 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                coder->pos_align[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
                uVar33 = (ulong)((int)uVar33 + 2);
              }
switchD_004dc17b_caseD_2e:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_ALIGN2;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = coder->pos_align[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                coder->pos_align[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                coder->pos_align[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
                uVar33 = (ulong)((int)uVar33 + 4);
              }
switchD_004dc17b_caseD_2f:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_ALIGN3;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = coder->pos_align[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar23 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar23 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                sVar11 = -(uVar2 >> 5);
                uVar33 = (ulong)((int)uVar33 + 8);
              }
              coder->pos_align[uVar22] = sVar11 + uVar2;
              if ((int)uVar33 != -1) goto switchD_004de121_default;
              uVar33 = 0xffffffff;
              uVar18 = 0xffffffff;
              if (coder->uncompressed_size == 0xffffffffffffffff) goto switchD_004dc17b_caseD_30;
            }
            uVar34 = (uint)uVar22;
            uVar18 = (uint)uVar33;
            lVar29 = LZMA_DATA_ERROR;
            bVar12 = false;
            bVar13 = false;
            goto LAB_004def80;
          }
          uVar31 = uVar21 - uVar31;
          coder->is_rep[uVar19] = uVar2 - (uVar2 >> 5);
          local_cc = uVar15;
          if (local_b0 == 0) {
            lVar29 = LZMA_DATA_ERROR;
            local_b0 = 0;
            bVar12 = false;
            bVar13 = false;
            uVar23 = uVar20;
            break;
          }
switchD_004dc17b_caseD_31:
          uVar23 = uVar20;
          uVar18 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar28 == in_size) {
              coder->sequence = SEQ_IS_REP0;
              sVar27 = sVar26;
              sVar28 = in_size;
              goto LAB_004def73;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar23 = (uint)*pbVar1 | uVar20 << 8;
            uVar18 = uVar31 << 8;
          }
          uVar19 = (ulong)local_d0;
          uVar2 = coder->is_rep0[uVar19];
          uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar20 = uVar23 - uVar31;
          if (uVar23 < uVar31) {
            coder->is_rep0[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_004dc17b_caseD_33:
            uVar34 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_IS_REP0_LONG;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar34 = uVar31 << 8;
            }
            ppVar24 = coder->is_rep0_long[local_d0] + local_b8;
            uVar2 = *ppVar24;
            uVar31 = (uVar34 >> 0xb) * (uint)uVar2;
            if (uVar23 < uVar31) {
              *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
              local_d0 = (uint)(STATE_SHORTREP_LIT < local_d0) * 2 + STATE_LIT_SHORTREP;
switchD_004dc17b_caseD_32:
              if (sVar26 == sVar27) {
                coder->sequence = SEQ_SHORTREP;
                goto LAB_004def73;
              }
              sVar17 = 0;
              if (sVar26 <= uVar33) {
                sVar17 = sVar8;
              }
              puVar6[sVar26] = puVar6[sVar17 + sVar26 + ~uVar33];
              goto LAB_004dea19;
            }
            *ppVar24 = uVar2 - (uVar2 >> 5);
            uVar23 = uVar23 - uVar31;
            uVar15 = (uint)uVar33;
            uVar18 = local_bc;
            uVar31 = uVar34 - uVar31;
          }
          else {
            uVar31 = uVar18 - uVar31;
            coder->is_rep0[uVar19] = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_34:
            uVar18 = (uint)uVar33;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_IS_REP1;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
            }
            uVar19 = (ulong)local_d0;
            uVar2 = coder->is_rep1[uVar19];
            uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar23 = uVar20 - uVar34;
            if (uVar20 < uVar34) {
              coder->is_rep1[uVar19] = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar23 = uVar20;
              uVar15 = local_bc;
              uVar31 = uVar34;
            }
            else {
              uVar31 = uVar31 - uVar34;
              coder->is_rep1[uVar19] = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_35:
              uVar15 = local_a4;
              uVar18 = (uint)uVar33;
              uVar34 = uVar23;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_IS_REP2;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar34 = (uint)*pbVar1 | uVar23 << 8;
              }
              uVar33 = (ulong)local_d0;
              uVar2 = coder->is_rep2[uVar33];
              uVar20 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar23 = uVar34 - uVar20;
              if (uVar34 < uVar20) {
                coder->is_rep2[uVar33] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar23 = uVar34;
                uVar15 = local_cc;
                local_cc = local_bc;
                uVar31 = uVar20;
              }
              else {
                uVar31 = uVar31 - uVar20;
                coder->is_rep2[uVar33] = uVar2 - (uVar2 >> 5);
                local_a4 = local_cc;
                local_cc = local_bc;
              }
            }
          }
          local_d0 = (uint)(STATE_SHORTREP_LIT < local_d0) * 3 + STATE_LIT_LONGREP;
          uVar33 = (ulong)uVar15;
          uVar22 = 1;
          local_bc = uVar18;
switchD_004dc17b_caseD_36:
          uVar18 = uVar31;
          if (uVar31 < 0x1000000) {
            if (sVar28 == in_size) {
              coder->sequence = SEQ_REP_LEN_CHOICE;
              sVar27 = sVar26;
              sVar28 = in_size;
              goto LAB_004def73;
            }
            pbVar1 = in + sVar28;
            sVar28 = sVar28 + 1;
            uVar23 = (uint)*pbVar1 | uVar23 << 8;
            uVar18 = uVar31 << 8;
          }
          uVar2 = (coder->rep_len_decoder).choice;
          uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
          uVar20 = uVar23 - uVar31;
          if (uVar23 < uVar31) {
            (coder->rep_len_decoder).choice = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_004dc17b_caseD_37:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_REP_LEN_LOW0;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar23 << 8;
              uVar18 = uVar31 << 8;
            }
            ppVar24 = (coder->rep_len_decoder).low[local_b8] + uVar22;
            uVar2 = *ppVar24;
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar22 = (ulong)uVar34;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar20 = uVar23;
            }
            else {
              uVar31 = uVar18 - uVar31;
              *ppVar24 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_38:
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_REP_LEN_LOW1;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar20;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar20 = (uint)*pbVar1 | uVar20 << 8;
              uVar18 = uVar31 << 8;
            }
            ppVar24 = (coder->rep_len_decoder).low[local_b8] + uVar22;
            uVar2 = *ppVar24;
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar34 = (int)uVar22 * 2;
            uVar22 = (ulong)uVar34;
            uVar21 = uVar20 - uVar31;
            if (uVar20 < uVar31) {
              *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
              uVar21 = uVar20;
            }
            else {
              uVar31 = uVar18 - uVar31;
              *ppVar24 = uVar2 - (uVar2 >> 5);
              uVar22 = (ulong)(uVar34 | 1);
            }
switchD_004dc17b_caseD_39:
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_REP_LEN_LOW2;
                sVar27 = sVar26;
                sVar28 = in_size;
                uVar23 = uVar21;
                goto LAB_004def73;
              }
              uVar31 = uVar31 << 8;
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar21 = (uint)*pbVar1 | uVar21 << 8;
            }
            ppVar24 = (coder->rep_len_decoder).low[local_b8] + uVar22;
            uVar2 = *ppVar24;
            uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
            uVar18 = (int)uVar22 * 2;
            uVar23 = uVar21 - uVar34;
            if (uVar21 < uVar34) {
              sVar11 = (short)(0x800 - uVar2 >> 5);
              uVar23 = uVar21;
              uVar31 = uVar34;
            }
            else {
              uVar31 = uVar31 - uVar34;
              sVar11 = -(uVar2 >> 5);
              uVar18 = uVar18 | 1;
            }
            *ppVar24 = sVar11 + uVar2;
            uVar34 = uVar18 - 6;
          }
          else {
            uVar31 = uVar18 - uVar31;
            (coder->rep_len_decoder).choice = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_3a:
            uVar23 = uVar20;
            uVar18 = uVar31;
            if (uVar31 < 0x1000000) {
              if (sVar28 == in_size) {
                coder->sequence = SEQ_REP_LEN_CHOICE2;
                sVar27 = sVar26;
                sVar28 = in_size;
                goto LAB_004def73;
              }
              pbVar1 = in + sVar28;
              sVar28 = sVar28 + 1;
              uVar23 = (uint)*pbVar1 | uVar20 << 8;
              uVar18 = uVar31 << 8;
            }
            uVar2 = (coder->rep_len_decoder).choice2;
            uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
            uVar20 = uVar23 - uVar31;
            if (uVar23 < uVar31) {
              (coder->rep_len_decoder).choice2 = (short)(0x800 - uVar2 >> 5) + uVar2;
switchD_004dc17b_caseD_3b:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_MID0;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              ppVar24 = (coder->rep_len_decoder).mid[local_b8] + uVar22;
              uVar2 = *ppVar24;
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar34;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                *ppVar24 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_3c:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_MID1;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              ppVar24 = (coder->rep_len_decoder).mid[local_b8] + uVar22;
              uVar2 = *ppVar24;
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar22 = (ulong)uVar34;
              uVar21 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                *ppVar24 = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar21 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                *ppVar24 = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_3d:
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_MID2;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar21;
                  goto LAB_004def73;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar21 = (uint)*pbVar1 | uVar21 << 8;
              }
              ppVar24 = (coder->rep_len_decoder).mid[local_b8] + uVar22;
              uVar2 = *ppVar24;
              uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar18 = (int)uVar22 * 2;
              uVar23 = uVar21 - uVar34;
              if (uVar21 < uVar34) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar23 = uVar21;
                uVar31 = uVar34;
              }
              else {
                uVar31 = uVar31 - uVar34;
                sVar11 = -(uVar2 >> 5);
                uVar18 = uVar18 | 1;
              }
              *ppVar24 = sVar11 + uVar2;
              uVar34 = uVar18 + 2;
            }
            else {
              uVar31 = uVar18 - uVar31;
              (coder->rep_len_decoder).choice2 = uVar2 - (uVar2 >> 5);
switchD_004dc17b_caseD_3e:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH0;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar23 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar23 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_3f:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH1;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_40:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH2;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar23 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar23 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_41:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH3;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_42:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH4;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar23 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar23 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_43:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH5;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar23 = (uint)*pbVar1 | uVar23 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar20 = uVar23 - uVar31;
              if (uVar23 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar20 = uVar23;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_44:
              uVar18 = uVar31;
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH6;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar20;
                  goto LAB_004def73;
                }
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar20 = (uint)*pbVar1 | uVar20 << 8;
                uVar18 = uVar31 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
              uVar34 = (int)uVar22 * 2;
              uVar21 = uVar20 - uVar31;
              if (uVar20 < uVar31) {
                (coder->rep_len_decoder).high[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
                uVar22 = (ulong)uVar34;
                uVar21 = uVar20;
              }
              else {
                uVar31 = uVar18 - uVar31;
                (coder->rep_len_decoder).high[uVar22] = uVar2 - (uVar2 >> 5);
                uVar22 = (ulong)(uVar34 | 1);
              }
switchD_004dc17b_caseD_45:
              if (uVar31 < 0x1000000) {
                if (sVar28 == in_size) {
                  coder->sequence = SEQ_REP_LEN_HIGH7;
                  sVar27 = sVar26;
                  sVar28 = in_size;
                  uVar23 = uVar21;
                  goto LAB_004def73;
                }
                uVar31 = uVar31 << 8;
                pbVar1 = in + sVar28;
                sVar28 = sVar28 + 1;
                uVar21 = (uint)*pbVar1 | uVar21 << 8;
              }
              uVar2 = (coder->rep_len_decoder).high[uVar22];
              uVar34 = (uVar31 >> 0xb) * (uint)uVar2;
              uVar18 = (int)uVar22 * 2;
              uVar23 = uVar21 - uVar34;
              if (uVar21 < uVar34) {
                sVar11 = (short)(0x800 - uVar2 >> 5);
                uVar23 = uVar21;
                uVar31 = uVar34;
              }
              else {
                uVar31 = uVar31 - uVar34;
                sVar11 = -(uVar2 >> 5);
                uVar18 = uVar18 | 1;
              }
              (coder->rep_len_decoder).high[uVar22] = sVar11 + uVar2;
              uVar34 = uVar18 - 0xee;
            }
          }
          uVar22 = (ulong)uVar18;
          local_f8 = (ulong)uVar34;
LAB_004ded80:
          if ((uint)local_f8 < 2) {
            __assert_fail("len >= MATCH_LEN_MIN",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x312,
                          "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
          if (0x111 < (uint)local_f8) {
            __assert_fail("len <= MATCH_LEN_MAX",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_decoder.c"
                          ,0x313,
                          "lzma_ret lzma_decode(lzma_coder *restrict, lzma_dict *restrict, const uint8_t *restrict, size_t *restrict, size_t)"
                         );
          }
switchD_004dc17b_caseD_46:
          uVar19 = sVar27 - sVar26;
          if (local_f8 <= sVar27 - sVar26) {
            uVar19 = local_f8;
          }
          __n = uVar19 & 0xffffffff;
          uVar34 = (uint)uVar19;
          local_f8._0_4_ = (int)local_f8 - uVar34;
          uVar18 = (uint)uVar33;
          if (uVar18 < uVar34) {
            do {
              sVar17 = sVar8;
              if (uVar33 < sVar26) {
                sVar17 = 0;
              }
              puVar6[sVar26] = puVar6[sVar26 + sVar17 + ~uVar33];
              sVar26 = sVar26 + 1;
              uVar34 = (int)__n - 1;
              __n = (ulong)uVar34;
            } while (uVar34 != 0);
          }
          else {
            if (uVar33 < sVar26) {
              __dest = puVar6 + sVar26;
              __n = uVar19 & 0xffffffff;
              __src = __dest + ~uVar33;
LAB_004dee9d:
              memcpy(__dest,__src,__n);
            }
            else {
              if (local_b0 != sVar8) {
                __assert_fail("dict->full == dict->size",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_decoder.h"
                              ,0xa0,"_Bool dict_repeat(lzma_dict *, uint32_t, uint32_t *)");
              }
              iVar32 = ~uVar18 + (int)sVar26;
              uVar15 = -iVar32;
              if (uVar15 < uVar34) {
                memmove(puVar6 + sVar26,puVar6 + (uint)((int)sVar8 + iVar32),(ulong)uVar15);
                sVar26 = sVar26 + uVar15;
                __n = (ulong)(uVar34 + iVar32);
                __dest = puVar6 + sVar26;
                __src = puVar6;
                goto LAB_004dee9d;
              }
              memmove(puVar6 + sVar26,puVar6 + (uint)((int)sVar8 + iVar32),__n);
            }
            sVar26 = sVar26 + __n;
          }
          if (local_b0 <= sVar26) {
            local_b0 = sVar26;
          }
          if ((uint)local_f8 != 0) goto LAB_004df0fd;
          local_f8 = 0;
        }
        local_b8 = (ulong)(uVar3 & (uint)sVar26);
      } while( true );
    case SEQ_BLOCK:
      goto switchD_004dc17b_caseD_2;
    case SEQ_CODER_INIT:
      goto switchD_004dc17b_caseD_3;
    case SEQ_CODE:
      goto switchD_004dc17b_caseD_4;
    case SEQ_LITERAL3:
      goto switchD_004dc17b_caseD_5;
    case SEQ_CRC32:
      goto switchD_004dc17b_caseD_6;
    case SEQ_LITERAL5:
      goto switchD_004dc17b_caseD_7;
    case SEQ_LITERAL6:
      goto switchD_004dc17b_caseD_8;
    case SEQ_LITERAL7:
      goto switchD_004dc17b_caseD_9;
    case SEQ_LITERAL_MATCHED0:
      goto switchD_004dc17b_caseD_a;
    case SEQ_LITERAL_MATCHED1:
      goto switchD_004dc17b_caseD_b;
    case SEQ_LITERAL_MATCHED2:
      goto switchD_004dc17b_caseD_c;
    case SEQ_LITERAL_MATCHED3:
      goto switchD_004dc17b_caseD_d;
    case SEQ_LITERAL_MATCHED4:
      goto switchD_004dc17b_caseD_e;
    case SEQ_LITERAL_MATCHED5:
      goto switchD_004dc17b_caseD_f;
    case SEQ_LITERAL_MATCHED6:
      goto switchD_004dc17b_caseD_10;
    case SEQ_LITERAL_MATCHED7:
      goto switchD_004dc17b_caseD_11;
    case SEQ_LITERAL_WRITE:
      goto switchD_004dc17b_caseD_12;
    case SEQ_IS_REP:
      goto switchD_004dc17b_caseD_13;
    case SEQ_MATCH_LEN_CHOICE:
      goto switchD_004dc17b_caseD_14;
    case SEQ_MATCH_LEN_LOW0:
      goto switchD_004dc17b_caseD_15;
    case SEQ_MATCH_LEN_LOW1:
      goto switchD_004dc17b_caseD_16;
    case SEQ_MATCH_LEN_LOW2:
      goto switchD_004dc17b_caseD_17;
    case SEQ_MATCH_LEN_CHOICE2:
      goto switchD_004dc17b_caseD_18;
    case SEQ_MATCH_LEN_MID0:
      goto switchD_004dc17b_caseD_19;
    case SEQ_MATCH_LEN_MID1:
      goto switchD_004dc17b_caseD_1a;
    case SEQ_MATCH_LEN_MID2:
      goto switchD_004dc17b_caseD_1b;
    case SEQ_MATCH_LEN_HIGH0:
      goto switchD_004dc17b_caseD_1c;
    case SEQ_MATCH_LEN_HIGH1:
      goto switchD_004dc17b_caseD_1d;
    case SEQ_MATCH_LEN_HIGH2:
      goto switchD_004dc17b_caseD_1e;
    case SEQ_MATCH_LEN_HIGH3:
      goto switchD_004dc17b_caseD_1f;
    case SEQ_MATCH_LEN_HIGH4:
      goto switchD_004dc17b_caseD_20;
    case SEQ_MATCH_LEN_HIGH5:
      goto switchD_004dc17b_caseD_21;
    case SEQ_MATCH_LEN_HIGH6:
      goto switchD_004dc17b_caseD_22;
    case SEQ_MATCH_LEN_HIGH7:
      goto switchD_004dc17b_caseD_23;
    case SEQ_POS_SLOT0:
      goto switchD_004dc17b_caseD_24;
    case SEQ_POS_SLOT1:
      goto switchD_004dc17b_caseD_25;
    case SEQ_POS_SLOT2:
      goto switchD_004dc17b_caseD_26;
    case SEQ_POS_SLOT3:
      goto switchD_004dc17b_caseD_27;
    case SEQ_POS_SLOT4:
      goto switchD_004dc17b_caseD_28;
    case SEQ_POS_SLOT5:
      goto switchD_004dc17b_caseD_29;
    case SEQ_POS_MODEL:
      goto switchD_004dc17b_caseD_2a;
    case SEQ_DIRECT:
      goto switchD_004dc17b_caseD_2b;
    case SEQ_ALIGN0:
      goto switchD_004dc17b_caseD_2c;
    case SEQ_ALIGN1:
      goto switchD_004dc17b_caseD_2d;
    case SEQ_ALIGN2:
      goto switchD_004dc17b_caseD_2e;
    case SEQ_ALIGN3:
      goto switchD_004dc17b_caseD_2f;
    case SEQ_EOPM:
switchD_004dc17b_caseD_30:
      uVar34 = (uint)uVar22;
      lVar29 = LZMA_STREAM_END;
      bVar13 = true;
      if (uVar31 < 0x1000000) {
        if (sVar28 == in_size) {
          coder->sequence = SEQ_EOPM;
LAB_004def76:
          bVar13 = false;
          bVar12 = true;
          lVar29 = LZMA_OK;
          sVar28 = in_size;
        }
        else {
          uVar31 = uVar31 << 8;
          uVar23 = (uint)in[sVar28] | uVar23 << 8;
          bVar12 = false;
          sVar28 = sVar28 + 1;
        }
      }
      else {
        bVar12 = false;
      }
LAB_004def80:
      break;
    case SEQ_IS_REP0:
      goto switchD_004dc17b_caseD_31;
    case SEQ_SHORTREP:
      goto switchD_004dc17b_caseD_32;
    case SEQ_IS_REP0_LONG:
      goto switchD_004dc17b_caseD_33;
    case SEQ_IS_REP1:
      goto switchD_004dc17b_caseD_34;
    case SEQ_IS_REP2:
      goto switchD_004dc17b_caseD_35;
    case SEQ_REP_LEN_CHOICE:
      goto switchD_004dc17b_caseD_36;
    case SEQ_REP_LEN_LOW0:
      goto switchD_004dc17b_caseD_37;
    case SEQ_REP_LEN_LOW1:
      goto switchD_004dc17b_caseD_38;
    case SEQ_REP_LEN_LOW2:
      goto switchD_004dc17b_caseD_39;
    case SEQ_REP_LEN_CHOICE2:
      goto switchD_004dc17b_caseD_3a;
    case SEQ_REP_LEN_MID0:
      goto switchD_004dc17b_caseD_3b;
    case SEQ_REP_LEN_MID1:
      goto switchD_004dc17b_caseD_3c;
    case SEQ_REP_LEN_MID2:
      goto switchD_004dc17b_caseD_3d;
    case SEQ_REP_LEN_HIGH0:
      goto switchD_004dc17b_caseD_3e;
    case SEQ_REP_LEN_HIGH1:
      goto switchD_004dc17b_caseD_3f;
    case SEQ_REP_LEN_HIGH2:
      goto switchD_004dc17b_caseD_40;
    case SEQ_REP_LEN_HIGH3:
      goto switchD_004dc17b_caseD_41;
    case SEQ_REP_LEN_HIGH4:
      goto switchD_004dc17b_caseD_42;
    case SEQ_REP_LEN_HIGH5:
      goto switchD_004dc17b_caseD_43;
    case SEQ_REP_LEN_HIGH6:
      goto switchD_004dc17b_caseD_44;
    case SEQ_REP_LEN_HIGH7:
      goto switchD_004dc17b_caseD_45;
    case SEQ_COPY:
      goto switchD_004dc17b_caseD_46;
    }
    goto LAB_004def84;
  }
LAB_004dc19b:
  local_f8._0_4_ = uVar15;
  sVar26 = sVar17;
  if (uVar31 < 0x1000000) {
    if (sVar28 != in_size) {
      uVar31 = uVar31 << 8;
      pbVar1 = in + sVar28;
      sVar28 = sVar28 + 1;
      uVar23 = (uint)*pbVar1 | uVar23 << 8;
      goto LAB_004dc1cb;
    }
    coder->sequence = SEQ_INDICATOR;
    sVar28 = in_size;
    uVar20 = uVar23;
  }
  else {
LAB_004dc1cb:
    coder->sequence = SEQ_BLOCK_HEADER;
    uVar20 = uVar23;
  }
LAB_004dc1dd:
  bVar13 = false;
  bVar12 = true;
  lVar29 = LZMA_OK;
  uVar23 = uVar20;
LAB_004def84:
  dictptr->pos = sVar26;
  dictptr->full = local_b0;
  *in_pos = sVar28;
  (coder->rc).range = uVar31;
  (coder->rc).code = uVar23;
  (coder->rc).init_bytes_left = 0;
  coder->state = local_d0;
  coder->rep0 = uVar18;
  coder->rep1 = local_bc;
  coder->rep2 = local_cc;
  coder->rep3 = local_a4;
  coder->probs = *local_e8;
  coder->symbol = uVar34;
  coder->limit = uVar30;
  coder->offset = uVar16;
  coder->len = (uint)local_f8;
  if ((coder->uncompressed_size == 0xffffffffffffffff) ||
     (lVar25 = coder->uncompressed_size + (sVar7 - sVar26), coder->uncompressed_size = lVar25,
     !bVar12 || lVar25 != 0)) {
    if (!bVar13) {
      return lVar29;
    }
  }
  else {
    if (coder->sequence == SEQ_INDICATOR) {
      return LZMA_OK;
    }
    if (coder->sequence != SEQ_BLOCK_HEADER) {
      return LZMA_DATA_ERROR;
    }
  }
  (coder->rc).range = 0xffffffff;
  (coder->rc).code = 0;
  (coder->rc).init_bytes_left = 5;
  return (uint)(uVar23 != 0) * 8 + LZMA_STREAM_END;
switchD_004de121_caseD_4:
  if (uVar31 < 0x1000000) {
    if (sVar28 == in_size) {
      coder->sequence = SEQ_POS_MODEL;
      uVar30 = 4;
      goto LAB_004df88b;
    }
    uVar31 = uVar31 << 8;
    pbVar1 = in + sVar28;
    sVar28 = sVar28 + 1;
    uVar23 = (uint)*pbVar1 | uVar23 << 8;
  }
  uVar2 = (*local_e8)[uVar19];
  uVar15 = (uVar31 >> 0xb) * (uint)uVar2;
  uVar18 = (int)uVar19 * 2;
  uVar34 = uVar23 - uVar15;
  if (uVar23 < uVar15) {
    sVar11 = (short)(0x800 - uVar2 >> 5);
    uVar34 = uVar23;
    uVar31 = uVar15;
  }
  else {
    uVar31 = uVar31 - uVar15;
    sVar11 = -(uVar2 >> 5);
    uVar18 = uVar18 | 1;
    uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
  }
  uVar22 = (ulong)uVar18;
  (*local_e8)[uVar19] = sVar11 + uVar2;
  uVar16 = uVar16 + 1;
  uVar23 = uVar34;
switchD_004de121_caseD_3:
  if (0xffffff < uVar31) {
LAB_004deba9:
    uVar2 = (*local_e8)[uVar22];
    uVar15 = (uVar31 >> 0xb) * (uint)uVar2;
    uVar18 = (int)uVar22 * 2;
    uVar34 = uVar23 - uVar15;
    if (uVar23 < uVar15) {
      sVar11 = (short)(0x800 - uVar2 >> 5);
      uVar34 = uVar23;
      uVar31 = uVar15;
    }
    else {
      uVar31 = uVar31 - uVar15;
      sVar11 = -(uVar2 >> 5);
      uVar18 = uVar18 | 1;
      uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
    }
    uVar19 = (ulong)uVar18;
    (*local_e8)[uVar22] = sVar11 + uVar2;
    uVar16 = uVar16 + 1;
    uVar23 = uVar34;
switchD_004de121_caseD_2:
    if (uVar31 < 0x1000000) {
      if (sVar28 == in_size) {
        coder->sequence = SEQ_POS_MODEL;
        uVar30 = 2;
        goto LAB_004df88b;
      }
      uVar31 = uVar31 << 8;
      pbVar1 = in + sVar28;
      sVar28 = sVar28 + 1;
      uVar23 = (uint)*pbVar1 | uVar23 << 8;
    }
    uVar2 = (*local_e8)[uVar19];
    uVar15 = (uVar31 >> 0xb) * (uint)uVar2;
    uVar18 = (int)uVar19 * 2;
    uVar34 = uVar23 - uVar15;
    if (uVar23 < uVar15) {
      sVar11 = (short)(0x800 - uVar2 >> 5);
      uVar34 = uVar23;
      uVar31 = uVar15;
    }
    else {
      uVar31 = uVar31 - uVar15;
      sVar11 = -(uVar2 >> 5);
      uVar18 = uVar18 | 1;
      uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
    }
    uVar22 = (ulong)uVar18;
    (*local_e8)[uVar19] = sVar11 + uVar2;
    uVar16 = uVar16 + 1;
    uVar23 = uVar34;
LAB_004decd6:
    uVar18 = uVar31;
    if (uVar31 < 0x1000000) {
      if (sVar28 == in_size) {
        coder->sequence = SEQ_POS_MODEL;
        uVar30 = 1;
        sVar27 = sVar26;
        sVar28 = in_size;
        goto LAB_004def73;
      }
      pbVar1 = in + sVar28;
      sVar28 = sVar28 + 1;
      uVar23 = (uint)*pbVar1 | uVar23 << 8;
      uVar18 = uVar31 << 8;
    }
    uVar2 = (*local_e8)[uVar22];
    uVar31 = (uVar18 >> 0xb) * (uint)uVar2;
    uVar34 = uVar23 - uVar31;
    if (uVar23 < uVar31) {
      (*local_e8)[uVar22] = (short)(0x800 - uVar2 >> 5) + uVar2;
      uVar30 = 1;
    }
    else {
      uVar31 = uVar18 - uVar31;
      (*local_e8)[uVar22] = uVar2 - (uVar2 >> 5);
      uVar30 = 1;
      uVar33 = (ulong)(uint)((1 << ((byte)uVar16 & 0x1f)) + (int)uVar33);
      uVar23 = uVar34;
    }
    goto switchD_004de121_default;
  }
  if (sVar28 != in_size) {
    uVar31 = uVar31 << 8;
    pbVar1 = in + sVar28;
    sVar28 = sVar28 + 1;
    uVar23 = (uint)*pbVar1 | uVar23 << 8;
    goto LAB_004deba9;
  }
  coder->sequence = SEQ_POS_MODEL;
  uVar30 = 3;
  uVar19 = uVar22;
LAB_004df88b:
  uVar34 = (uint)uVar19;
  uVar18 = (uint)uVar33;
  bVar13 = false;
  bVar12 = true;
  lVar29 = LZMA_OK;
  sVar28 = in_size;
  goto LAB_004def80;
LAB_004df0fd:
  coder->sequence = SEQ_COPY;
  bVar13 = false;
  bVar12 = true;
  lVar29 = LZMA_OK;
  uVar34 = (uint)uVar22;
  goto LAB_004def84;
}

Assistant:

static lzma_ret
lzma_decode(lzma_coder *LZMA_RESTRICT coder, lzma_dict *LZMA_RESTRICT dictptr,
		const uint8_t *LZMA_RESTRICT in,
		size_t *LZMA_RESTRICT in_pos, size_t in_size)
{
	///////////////
	// Variables //
	///////////////

	// Making local copies of often-used variables improves both
	// speed and readability.

	lzma_dict dict = *dictptr;

	const size_t dict_start = dict.pos;

	// Range decoder
	rc_to_local(coder->rc, *in_pos);

	// State
	uint32_t state = coder->state;
	uint32_t rep0 = coder->rep0;
	uint32_t rep1 = coder->rep1;
	uint32_t rep2 = coder->rep2;
	uint32_t rep3 = coder->rep3;

	const uint32_t pos_mask = coder->pos_mask;

	// These variables are actually needed only if we last time ran
	// out of input in the middle of the decoder loop.
	probability *probs = coder->probs;
	uint32_t symbol = coder->symbol;
	uint32_t limit = coder->limit;
	uint32_t offset = coder->offset;
	uint32_t len = coder->len;

	const uint32_t literal_pos_mask = coder->literal_pos_mask;
	const uint32_t literal_context_bits = coder->literal_context_bits;

	// Temporary variables
	uint32_t pos_state = dict.pos & pos_mask;

	lzma_ret ret = LZMA_OK;

	// If uncompressed size is known, there must be no end of payload
	// marker.
	const bool no_eopm = coder->uncompressed_size
			!= LZMA_VLI_UNKNOWN;
	if (no_eopm && coder->uncompressed_size < dict.limit - dict.pos)
		dict.limit = dict.pos + (size_t)(coder->uncompressed_size);

	////////////////////
	// Initialization //
	////////////////////

	if (!rc_read_init(&coder->rc, in, in_pos, in_size))
		return LZMA_OK;

	rc = coder->rc;
	rc_in_pos = *in_pos;

	// The main decoder loop. The "switch" is used to restart the decoder at
	// correct location. Once restarted, the "switch" is no longer used.
	switch (coder->sequence)
	while (true) {
		// Calculate new pos_state. This is skipped on the first loop
		// since we already calculated it when setting up the local
		// variables.
		pos_state = dict.pos & pos_mask;

	case SEQ_NORMALIZE:
	case SEQ_IS_MATCH:
		if (unlikely(no_eopm && dict.pos == dict.limit))
			break;

		rc_if_0(coder->is_match[state][pos_state], SEQ_IS_MATCH) {
			static const lzma_lzma_state next_state[] = {
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_LIT_LIT,
				STATE_MATCH_LIT_LIT,
				STATE_REP_LIT_LIT,
				STATE_SHORTREP_LIT_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT,
				STATE_SHORTREP_LIT,
				STATE_MATCH_LIT,
				STATE_REP_LIT
			};

			rc_update_0(coder->is_match[state][pos_state]);

			// It's a literal i.e. a single 8-bit byte.

			probs = literal_subcoder(coder->literal,
					literal_context_bits, literal_pos_mask,
					dict.pos, dict_get(&dict, 0));
			symbol = 1;

			if (is_literal_state(state)) {
				// Decode literal without match byte.
#ifdef HAVE_SMALL
	case SEQ_LITERAL:
				do {
					rc_bit(probs[symbol], , , SEQ_LITERAL);
				} while (symbol < (1 << 8));
#else
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL0);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL1);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL2);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL3);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL4);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL5);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL6);
				rc_bit_case(probs[symbol], 0, 0, SEQ_LITERAL7);
#endif
			} else {
#ifndef HAVE_SMALL
				uint32_t match_bit;
				uint32_t subcoder_index;
#endif

				// Decode literal with match byte.
				//
				// We store the byte we compare against
				// ("match byte") to "len" to minimize the
				// number of variables we need to store
				// between decoder calls.
				len = dict_get(&dict, rep0) << 1;

				// The usage of "offset" allows omitting some
				// branches, which should give tiny speed
				// improvement on some CPUs. "offset" gets
				// set to zero if match_bit didn't match.
				offset = 0x100;

#ifdef HAVE_SMALL
	case SEQ_LITERAL_MATCHED:
				do {
					const uint32_t match_bit
							= len & offset;
					const uint32_t subcoder_index
							= offset + match_bit
							+ symbol;

					rc_bit(probs[subcoder_index],
							offset &= ~match_bit,
							offset &= match_bit,
							SEQ_LITERAL_MATCHED);

					// It seems to be faster to do this
					// here instead of putting it to the
					// beginning of the loop and then
					// putting the "case" in the middle
					// of the loop.
					len <<= 1;

				} while (symbol < (1 << 8));
#else
				// Unroll the loop.

#	define d(seq) \
		case seq: \
			match_bit = len & offset; \
			subcoder_index = offset + match_bit + symbol; \
			rc_bit(probs[subcoder_index], \
					offset &= ~match_bit, \
					offset &= match_bit, \
					seq)

				d(SEQ_LITERAL_MATCHED0);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED1);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED2);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED3);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED4);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED5);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED6);
				len <<= 1;
				d(SEQ_LITERAL_MATCHED7);
#	undef d
#endif
			}

			//update_literal(state);
			// Use a lookup table to update to literal state,
			// since compared to other state updates, this would
			// need two branches.
			state = next_state[state];

	case SEQ_LITERAL_WRITE:
			if (unlikely(dict_put(&dict, symbol))) {
				coder->sequence = SEQ_LITERAL_WRITE;
				goto out;
			}

			continue;
		}

		// Instead of a new byte we are going to get a byte range
		// (distance and length) which will be repeated from our
		// output history.

		rc_update_1(coder->is_match[state][pos_state]);

	case SEQ_IS_REP:
		rc_if_0(coder->is_rep[state], SEQ_IS_REP) {
			// Not a repeated match
			rc_update_0(coder->is_rep[state]);
			update_match(state);

			// The latest three match distances are kept in
			// memory in case there are repeated matches.
			rep3 = rep2;
			rep2 = rep1;
			rep1 = rep0;

			// Decode the length of the match.
			len_decode(len, coder->match_len_decoder,
					pos_state, SEQ_MATCH_LEN);

			// Prepare to decode the highest two bits of the
			// match distance.
			probs = coder->pos_slot[get_len_to_pos_state(len)];
			symbol = 1;

#ifdef HAVE_SMALL
	case SEQ_POS_SLOT:
			do {
				rc_bit(probs[symbol], , , SEQ_POS_SLOT);
			} while (symbol < POS_SLOTS);
#else
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT0);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT1);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT2);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT3);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT4);
			rc_bit_case(probs[symbol], 0, 0, SEQ_POS_SLOT5);
#endif
			// Get rid of the highest bit that was needed for
			// indexing of the probability array.
			symbol -= POS_SLOTS;
			assert(symbol <= 63);

			if (symbol < START_POS_MODEL_INDEX) {
				// Match distances [0, 3] have only two bits.
				rep0 = symbol;
			} else {
				// Decode the lowest [1, 29] bits of
				// the match distance.
				limit = (symbol >> 1) - 1;
				assert(limit >= 1 && limit <= 30);
				rep0 = 2 + (symbol & 1);

				if (symbol < END_POS_MODEL_INDEX) {
					// Prepare to decode the low bits for
					// a distance of [4, 127].
					assert(limit <= 5);
					rep0 <<= limit;
					assert(rep0 <= 96);
					// -1 is fine, because we start
					// decoding at probs[1], not probs[0].
					// NOTE: This violates the C standard,
					// since we are doing pointer
					// arithmetic past the beginning of
					// the array.
					assert((int32_t)(rep0 - symbol - 1)
							>= -1);
					assert((int32_t)(rep0 - symbol - 1)
							<= 82);
					probs = coder->pos_special + rep0
							- symbol - 1;
					symbol = 1;
					offset = 0;
	case SEQ_POS_MODEL:
#ifdef HAVE_SMALL
					do {
						rc_bit(probs[symbol], ,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					} while (++offset < limit);
#else
					switch (limit) {
					case 5:
						assert(offset == 0);
						rc_bit(probs[symbol], 0,
							rep0 += 1,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 4:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 3:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 2:
						rc_bit(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
						++offset;
						--limit;
					case 1:
						// We need "symbol" only for
						// indexing the probability
						// array, thus we can use
						// rc_bit_last() here to omit
						// the unneeded updating of
						// "symbol".
						rc_bit_last(probs[symbol], 0,
							rep0 += 1 << offset,
							SEQ_POS_MODEL);
					}
#endif
				} else {
					// The distance is >= 128. Decode the
					// lower bits without probabilities
					// except the lowest four bits.
					assert(symbol >= 14);
					assert(limit >= 6);
					limit -= ALIGN_BITS;
					assert(limit >= 2);
	case SEQ_DIRECT:
					// Not worth manual unrolling
					do {
						rc_direct(rep0, SEQ_DIRECT);
					} while (--limit > 0);

					// Decode the lowest four bits using
					// probabilities.
					rep0 <<= ALIGN_BITS;
					symbol = 1;
#ifdef HAVE_SMALL
					offset = 0;
	case SEQ_ALIGN:
					do {
						rc_bit(coder->pos_align[
								symbol], ,
							rep0 += 1 << offset,
							SEQ_ALIGN);
					} while (++offset < ALIGN_BITS);
#else
	case SEQ_ALIGN0:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 1, SEQ_ALIGN0);
	case SEQ_ALIGN1:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 2, SEQ_ALIGN1);
	case SEQ_ALIGN2:
					rc_bit(coder->pos_align[symbol], 0,
							rep0 += 4, SEQ_ALIGN2);
	case SEQ_ALIGN3:
					// Like in SEQ_POS_MODEL, we don't
					// need "symbol" for anything else
					// than indexing the probability array.
					rc_bit_last(coder->pos_align[symbol], 0,
							rep0 += 8, SEQ_ALIGN3);
#endif

					if (rep0 == UINT32_MAX) {
						// End of payload marker was
						// found. It must not be
						// present if uncompressed
						// size is known.
						if (coder->uncompressed_size
						!= LZMA_VLI_UNKNOWN) {
							ret = LZMA_DATA_ERROR;
							goto out;
						}

	case SEQ_EOPM:
						// LZMA1 stream with
						// end-of-payload marker.
						rc_normalize(SEQ_EOPM);
						ret = LZMA_STREAM_END;
						goto out;
					}
				}
			}

			// Validate the distance we just decoded.
			if (unlikely(!dict_is_distance_valid(&dict, rep0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

		} else {
			rc_update_1(coder->is_rep[state]);

			// Repeated match
			//
			// The match distance is a value that we have had
			// earlier. The latest four match distances are
			// available as rep0, rep1, rep2 and rep3. We will
			// now decode which of them is the new distance.
			//
			// There cannot be a match if we haven't produced
			// any output, so check that first.
			if (unlikely(!dict_is_distance_valid(&dict, 0))) {
				ret = LZMA_DATA_ERROR;
				goto out;
			}

	case SEQ_IS_REP0:
			rc_if_0(coder->is_rep0[state], SEQ_IS_REP0) {
				rc_update_0(coder->is_rep0[state]);
				// The distance is rep0.

	case SEQ_IS_REP0_LONG:
				rc_if_0(coder->is_rep0_long[state][pos_state],
						SEQ_IS_REP0_LONG) {
					rc_update_0(coder->is_rep0_long[
							state][pos_state]);

					update_short_rep(state);

	case SEQ_SHORTREP:
					if (unlikely(dict_put(&dict, dict_get(
							&dict, rep0)))) {
						coder->sequence = SEQ_SHORTREP;
						goto out;
					}

					continue;
				}

				// Repeating more than one byte at
				// distance of rep0.
				rc_update_1(coder->is_rep0_long[
						state][pos_state]);

			} else {
				rc_update_1(coder->is_rep0[state]);

	case SEQ_IS_REP1:
				// The distance is rep1, rep2 or rep3. Once
				// we find out which one of these three, it
				// is stored to rep0 and rep1, rep2 and rep3
				// are updated accordingly.
				rc_if_0(coder->is_rep1[state], SEQ_IS_REP1) {
					uint32_t distance;

					rc_update_0(coder->is_rep1[state]);

					distance = rep1;
					rep1 = rep0;
					rep0 = distance;

				} else {
					rc_update_1(coder->is_rep1[state]);
	case SEQ_IS_REP2:
					rc_if_0(coder->is_rep2[state],
							SEQ_IS_REP2) {
						uint32_t distance;

						rc_update_0(coder->is_rep2[
								state]);

						distance = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;

					} else {
						uint32_t distance;

						rc_update_1(coder->is_rep2[
								state]);

						distance = rep3;
						rep3 = rep2;
						rep2 = rep1;
						rep1 = rep0;
						rep0 = distance;
					}
				}
			}

			update_long_rep(state);

			// Decode the length of the repeated match.
			len_decode(len, coder->rep_len_decoder,
					pos_state, SEQ_REP_LEN);
		}

		/////////////////////////////////
		// Repeat from history buffer. //
		/////////////////////////////////

		// The length is always between these limits. There is no way
		// to trigger the algorithm to set len outside this range.
		assert(len >= MATCH_LEN_MIN);
		assert(len <= MATCH_LEN_MAX);

	case SEQ_COPY:
		// Repeat len bytes from distance of rep0.
		if (unlikely(dict_repeat(&dict, rep0, &len))) {
			coder->sequence = SEQ_COPY;
			goto out;
		}
	}

	rc_normalize(SEQ_NORMALIZE);
	coder->sequence = SEQ_IS_MATCH;

out:
	// Save state

	// NOTE: Must not copy dict.limit.
	dictptr->pos = dict.pos;
	dictptr->full = dict.full;

	rc_from_local(coder->rc, *in_pos);

	coder->state = state;
	coder->rep0 = rep0;
	coder->rep1 = rep1;
	coder->rep2 = rep2;
	coder->rep3 = rep3;

	coder->probs = probs;
	coder->symbol = symbol;
	coder->limit = limit;
	coder->offset = offset;
	coder->len = len;

	// Update the remaining amount of uncompressed data if uncompressed
	// size was known.
	if (coder->uncompressed_size != LZMA_VLI_UNKNOWN) {
		coder->uncompressed_size -= dict.pos - dict_start;

		// Since there cannot be end of payload marker if the
		// uncompressed size was known, we check here if we
		// finished decoding.
		if (coder->uncompressed_size == 0 && ret == LZMA_OK
				&& coder->sequence != SEQ_NORMALIZE)
			ret = coder->sequence == SEQ_IS_MATCH
					? LZMA_STREAM_END : LZMA_DATA_ERROR;
	}

	// We can do an additional check in the range decoder to catch some
	// corrupted files.
	if (ret == LZMA_STREAM_END) {
		if (!rc_is_finished(coder->rc))
			ret = LZMA_DATA_ERROR;

		// Reset the range decoder so that it is ready to reinitialize
		// for a new LZMA2 chunk.
		rc_reset(coder->rc);
	}

	return ret;
}